

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O2

void md_resolve_range(MD_CTX *ctx,int opener_index,int closer_index)

{
  MD_MARK *pMVar1;
  
  pMVar1 = ctx->marks;
  pMVar1[opener_index].next = closer_index;
  pMVar1[closer_index].prev = opener_index;
  pMVar1[opener_index].flags = pMVar1[opener_index].flags | 0x14;
  pMVar1[closer_index].flags = pMVar1[closer_index].flags | 0x18;
  return;
}

Assistant:

static inline void
md_resolve_range(MD_CTX* ctx, int opener_index, int closer_index)
{
    MD_MARK* opener = &ctx->marks[opener_index];
    MD_MARK* closer = &ctx->marks[closer_index];

    /* Interconnect opener and closer and mark both as resolved. */
    opener->next = closer_index;
    closer->prev = opener_index;

    opener->flags |= MD_MARK_OPENER | MD_MARK_RESOLVED;
    closer->flags |= MD_MARK_CLOSER | MD_MARK_RESOLVED;
}